

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

int __thiscall QPDFFormFieldObjectHelper::getQuadding(QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  int iVar2;
  QPDFObjectHandle fv;
  allocator<char> local_49;
  undefined1 local_48 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38 [4];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"/Q",(allocator<char> *)&stack0xffffffffffffffe8);
  getInheritableFieldValue((QPDFFormFieldObjectHelper *)local_48,(string *)this);
  std::__cxx11::string::~string((string *)local_38);
  bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_48);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"/Q",&local_49);
    getFieldFromAcroForm((QPDFFormFieldObjectHelper *)&stack0xffffffffffffffe8,(string *)this);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_48,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff0);
    std::__cxx11::string::~string((string *)local_38);
  }
  bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_48);
  iVar2 = 0;
  if (bVar1) {
    local_38[0]._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_48);
    iVar2 = QIntC::IntConverter<long_long,_int,_true,_true>::convert((longlong *)local_38);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  return iVar2;
}

Assistant:

int
QPDFFormFieldObjectHelper::getQuadding()
{
    QPDFObjectHandle fv = getInheritableFieldValue("/Q");
    bool looked_in_acroform = false;
    if (!fv.isInteger()) {
        fv = getFieldFromAcroForm("/Q");
        looked_in_acroform = true;
    }
    int result = 0;
    if (fv.isInteger()) {
        QTC::TC("qpdf", "QPDFFormFieldObjectHelper Q present", looked_in_acroform ? 0 : 1);
        result = QIntC::to_int(fv.getIntValue());
    }
    return result;
}